

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O0

bool duckdb::PipelineExceedsThreadCount(Pipeline *pipeline,idx_t thread_count)

{
  optional_ptr<duckdb::PhysicalOperator,_true> *poVar1;
  optional_ptr<duckdb::PhysicalOperator,_true> *in_RSI;
  Pipeline *in_RDI;
  PhysicalOperator *in_stack_00000030;
  
  Pipeline::GetSource(in_RDI);
  optional_ptr<duckdb::PhysicalOperator,_true>::operator->(in_RSI);
  poVar1 = (optional_ptr<duckdb::PhysicalOperator,_true> *)
           PhysicalOperator::EstimatedThreadCount(in_stack_00000030);
  return in_RSI < poVar1;
}

Assistant:

static bool PipelineExceedsThreadCount(Pipeline &pipeline, const idx_t thread_count) {
#ifdef DEBUG
	// we always add the dependency in debug mode so that this is well-tested
	return true;
#else
	return pipeline.GetSource()->EstimatedThreadCount() > thread_count;
#endif
}